

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O3

void write_complete(cio_websocket *websocket,void *handler_context,cio_error err)

{
  cio_error cVar1;
  char *reason;
  cio_websocket_status_code status_code;
  
  if (err == CIO_SUCCESS) {
    reason = "Good Bye!";
    status_code = CIO_WEBSOCKET_CLOSE_NORMAL;
  }
  else {
    reason = "write did not complete";
    status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
  }
  cVar1 = cio_websocket_close(websocket,status_code,reason,(cio_websocket_write_handler_t)0x0,
                              (void *)0x0);
  if (cVar1 != CIO_SUCCESS) {
    write_complete_cold_1();
  }
  return;
}

Assistant:

static void write_complete(struct cio_websocket *websocket, void *handler_context, enum cio_error err)
{
	(void)handler_context;

	if (err == CIO_SUCCESS) {
		static const char *close_message = "Good Bye!";
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_NORMAL, close_message, NULL, NULL);
	} else {
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "write did not complete", NULL, NULL);
	}

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "Could not start writing websocket close!\n");
	}
}